

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeCheckFk(Vdbe *p,int deferred)

{
  i64 *piVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  if (deferred == 0) {
    if (p->nFkConstraint < 1) {
      return 0;
    }
  }
  else {
    lVar2 = p->db->nDeferredImmCons;
    piVar1 = &p->db->nDeferredCons;
    lVar4 = lVar2 + *piVar1;
    if (lVar4 == 0 || SCARRY8(lVar2,*piVar1) != lVar4 < 0) {
      return 0;
    }
  }
  p->rc = 0x313;
  p->errorAction = '\x02';
  sqlite3VdbeError(p,"FOREIGN KEY constraint failed");
  iVar3 = 1;
  if ((char)p->prepFlags < '\0') {
    iVar3 = 0x313;
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeCheckFk(Vdbe *p, int deferred){
  sqlite3 *db = p->db;
  if( (deferred && (db->nDeferredCons+db->nDeferredImmCons)>0)
   || (!deferred && p->nFkConstraint>0)
  ){
    p->rc = SQLITE_CONSTRAINT_FOREIGNKEY;
    p->errorAction = OE_Abort;
    sqlite3VdbeError(p, "FOREIGN KEY constraint failed");
    if( (p->prepFlags & SQLITE_PREPARE_SAVESQL)==0 ) return SQLITE_ERROR;
    return SQLITE_CONSTRAINT_FOREIGNKEY;
  }
  return SQLITE_OK;
}